

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

exr_result_t internal_exr_apply_piz(exr_encode_pipeline_t *encode)

{
  int iVar1;
  uint16_t *__n;
  int iVar2;
  uint64_t uVar3;
  int iVar4;
  exr_result_t eVar5;
  uint8_t *bitmap_00;
  uint16_t *lut_00;
  long lVar6;
  void *pvVar7;
  long in_RDI;
  int j;
  exr_coding_channel_info_t *curc_1;
  int c_1;
  exr_coding_channel_info_t *curc;
  int c;
  int cury;
  int y;
  uint16_t *wavbuf;
  uint64_t ndata;
  uint64_t packedbytes;
  uint16_t maxValue;
  uint16_t maxNonZero;
  uint16_t minNonZero;
  size_t hufSpareBytes;
  uint8_t *hufspare;
  uint32_t *lengthptr;
  uint16_t *lut;
  uint8_t *bitmap;
  exr_result_t rv;
  uint64_t nBytes;
  uint64_t bpl;
  int wcount;
  int ny;
  int nx;
  uint8_t *packed;
  uint8_t *tmp;
  uint8_t *scratch;
  uint64_t nOut;
  uint8_t *out;
  undefined8 in_stack_ffffffffffffff18;
  uint16_t v;
  void *in_stack_ffffffffffffff20;
  int local_d4;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  size_t *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar8;
  exr_transcoding_pipeline_buffer_id_t in_stack_ffffffffffffff54;
  int iVar9;
  exr_encode_pipeline_t *in_stack_ffffffffffffff58;
  ushort local_8c;
  ushort local_8a;
  uint64_t local_88;
  long local_80;
  void *local_78;
  int in_stack_ffffffffffffffa0;
  int ny_00;
  long in_stack_ffffffffffffffa8;
  long lVar10;
  uint16_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  void *local_38;
  void *in_stack_ffffffffffffffd0;
  void *local_28;
  uint16_t *local_20;
  void *local_18;
  exr_result_t local_4;
  
  lVar10 = *(long *)(in_RDI + 0xa8);
  local_88 = internal_exr_huf_compress_spare_bytes();
  __n = *(uint16_t **)(in_RDI + 0x70);
  local_4 = internal_encode_alloc_buffer
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                       (void **)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff40,
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if ((local_4 == 0) &&
     (local_4 = internal_encode_alloc_buffer
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                           (void **)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                           in_stack_ffffffffffffff40,
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
     local_4 == 0)) {
    local_80 = *(long *)(in_RDI + 0xd0);
    bitmap_00 = (uint8_t *)(local_80 + local_88);
    lut_00 = (uint16_t *)(bitmap_00 + 0x2000);
    local_38 = *(void **)(in_RDI + 0x68);
    ny_00 = 0;
    for (iVar9 = 0; iVar9 < *(int *)(in_RDI + 0x2c); iVar9 = iVar9 + 1) {
      iVar4 = iVar9 + *(int *)(in_RDI + 0x28);
      local_28 = *(void **)(in_RDI + 0xc0);
      for (iVar8 = 0; iVar8 < *(short *)(in_RDI + 0x10); iVar8 = iVar8 + 1) {
        lVar6 = *(long *)(in_RDI + 8) + (long)iVar8 * 0x30;
        iVar1 = *(int *)(lVar6 + 0xc);
        in_stack_ffffffffffffffb0 = (uint16_t *)((long)iVar1 * (long)*(char *)(lVar6 + 0x19));
        in_stack_ffffffffffffffa8 = (long)*(int *)(lVar6 + 8) * (long)in_stack_ffffffffffffffb0;
        pvVar7 = local_28;
        if (in_stack_ffffffffffffffa8 != 0) {
          pvVar7 = (void *)(in_stack_ffffffffffffffa8 + (long)local_28);
          iVar2 = iVar9;
          if (1 < *(int *)(lVar6 + 0x14)) {
            in_stack_ffffffffffffffd0 = local_28;
            if (iVar4 % *(int *)(lVar6 + 0x14) != 0) goto LAB_00211f0f;
            iVar2 = iVar9 / *(int *)(lVar6 + 0x14);
          }
          in_stack_ffffffffffffffd0 =
               (void *)((long)iVar2 * (long)in_stack_ffffffffffffffb0 + (long)local_28);
          memcpy(in_stack_ffffffffffffffd0,local_38,(size_t)in_stack_ffffffffffffffb0);
          priv_to_native16(in_stack_ffffffffffffffd0,iVar1 * ((int)*(char *)(lVar6 + 0x19) / 2));
          local_38 = (void *)((long)in_stack_ffffffffffffffb0 + (long)local_38);
        }
LAB_00211f0f:
        local_28 = pvVar7;
      }
    }
    bitmapFromData(*(uint16_t **)(in_RDI + 0xc0),(ulong)__n >> 1,bitmap_00,&local_8a,&local_8c);
    forwardLutFromBitmap(bitmap_00,lut_00);
    applyLut(lut_00,*(uint16_t **)(in_RDI + 0xc0),(ulong)__n >> 1);
    if (*(ulong *)(in_RDI + 0xb8) < 4) {
      local_4 = 1;
    }
    else {
      v = (uint16_t)((ulong)in_stack_ffffffffffffff18 >> 0x30);
      unaligned_store16(in_stack_ffffffffffffff20,v);
      unaligned_store16(in_stack_ffffffffffffff20,v);
      local_18 = (void *)(lVar10 + 4);
      local_20 = (uint16_t *)0x4;
      if (local_8a <= local_8c) {
        in_stack_ffffffffffffffb0 = (uint16_t *)(long)(int)(((uint)local_8c - (uint)local_8a) + 1);
        if (*(uint16_t **)(in_RDI + 0xb8) < in_stack_ffffffffffffffb0 + 2) {
          return 1;
        }
        memcpy(local_18,bitmap_00 + (int)(uint)local_8a,(size_t)in_stack_ffffffffffffffb0);
        local_18 = (void *)((long)in_stack_ffffffffffffffb0 + (long)local_18);
        local_20 = in_stack_ffffffffffffffb0 + 2;
      }
      for (iVar9 = 0; uVar3 = local_88, iVar9 < *(short *)(in_RDI + 0x10); iVar9 = iVar9 + 1) {
        in_stack_ffffffffffffffbc =
             (int)*(char *)(*(long *)(in_RDI + 8) + (long)iVar9 * 0x30 + 0x19) / 2;
        for (local_d4 = 0; local_d4 < in_stack_ffffffffffffffbc; local_d4 = local_d4 + 1) {
          wav_2D_encode(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                        (int)in_stack_ffffffffffffffa8,ny_00,in_stack_ffffffffffffffa0,
                        (uint16_t)((ulong)bitmap_00 >> 0x30));
        }
      }
      lVar10 = 0;
      local_78 = local_18;
      local_20 = local_20 + 2;
      if (*(uint16_t **)(in_RDI + 0xb8) < local_20) {
        local_4 = 1;
      }
      else {
        eVar5 = internal_huf_compress
                          ((uint64_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           ,in_stack_ffffffffffffffb0,0,
                           (uint16_t *)CONCAT44(ny_00,in_stack_ffffffffffffffa0),(uint64_t)bitmap_00
                           ,lut_00,(uint64_t)in_stack_ffffffffffffffd0);
        if (eVar5 == 0) {
          if ((uint16_t *)(lVar10 + (long)local_20) < __n) {
            unaligned_store32(in_stack_ffffffffffffff20,(uint32_t)(uVar3 >> 0x20));
            local_20 = (uint16_t *)(lVar10 + (long)local_20);
          }
          else {
            memcpy(*(void **)(in_RDI + 0xa8),*(void **)(in_RDI + 0x68),(size_t)__n);
            local_20 = __n;
          }
        }
        else if (eVar5 == 4) {
          memcpy(*(void **)(in_RDI + 0xa8),*(void **)(in_RDI + 0x68),(size_t)__n);
          local_20 = __n;
        }
        *(uint16_t **)(in_RDI + 0xb0) = local_20;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_apply_piz (exr_encode_pipeline_t* encode)
{
    uint8_t*       out  = encode->compressed_buffer;
    uint64_t       nOut = 0;
    uint8_t *      scratch, *tmp;
    const uint8_t* packed;
    int            nx, ny, wcount;
    uint64_t       bpl, nBytes;
    exr_result_t   rv;
    uint8_t*       bitmap;
    uint16_t*      lut;
    uint32_t*      lengthptr;
    uint8_t*       hufspare;
    size_t         hufSpareBytes = internal_exr_huf_compress_spare_bytes ();
    uint16_t       minNonZero, maxNonZero, maxValue;
    uint64_t       packedbytes = encode->packed_bytes;
    uint64_t       ndata       = packedbytes / 2;
    uint16_t*      wavbuf;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->chunk.unpacked_size);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH2,
        &(encode->scratch_buffer_2),
        &(encode->scratch_alloc_size_2),
        BITMAP_SIZE * sizeof (uint8_t) + USHORT_RANGE * sizeof (uint16_t) +
            hufSpareBytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    hufspare = encode->scratch_buffer_2;
    bitmap   = hufspare + hufSpareBytes;
    lut      = (uint16_t*) (bitmap + BITMAP_SIZE);

    packed = encode->packed_buffer;
    for (int y = 0; y < encode->chunk.height; ++y)
    {
        int cury = y + encode->chunk.start_y;

        scratch = encode->scratch_buffer_1;
        for (int c = 0; c < encode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = encode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            scratch += nBytes;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0) continue;
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else { tmp += ((uint64_t) y) * bpl; }

            memcpy (tmp, packed, bpl);
            priv_to_native16 (tmp, nx * (curc->bytes_per_element / 2));
            packed += bpl;
        }
    }

    bitmapFromData (
        encode->scratch_buffer_1, ndata, bitmap, &minNonZero, &maxNonZero);

    maxValue = forwardLutFromBitmap (bitmap, lut);

    applyLut (lut, encode->scratch_buffer_1, ndata);

    if (4 > encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    nOut = 0;
    unaligned_store16 (out, minNonZero);
    out += 2;
    nOut += 2;
    unaligned_store16 (out, maxNonZero);
    out += 2;
    nOut += 2;
    if (minNonZero <= maxNonZero)
    {
        bpl = (uint64_t) (maxNonZero - minNonZero + 1);
        if ((nOut + bpl) > encode->compressed_alloc_size)
            return EXR_ERR_OUT_OF_MEMORY;

        memcpy (out, bitmap + minNonZero, bpl);
        out += bpl;
        nOut += bpl;
    }

    wavbuf = encode->scratch_buffer_1;
    for (int c = 0; c < encode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = encode->channels + c;

        nx     = curc->width;
        ny     = curc->height;
        wcount = (int) (curc->bytes_per_element / 2);
        for (int j = 0; j < wcount; ++j)
        {
            wav_2D_encode (wavbuf + j, nx, wcount, ny, wcount * nx, maxValue);
        }
        wavbuf += nx * ny * wcount;
    }

    nBytes    = 0;
    lengthptr = (uint32_t*) out;
    out += sizeof (uint32_t);
    nOut += sizeof (uint32_t);
    if (nOut > encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_huf_compress (
        &nBytes,
        out,
        encode->compressed_alloc_size - nOut,
        encode->scratch_buffer_1,
        ndata,
        hufspare,
        hufSpareBytes);
    if (rv != EXR_ERR_SUCCESS)
    {
        if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
        {
            memcpy (
                encode->compressed_buffer, encode->packed_buffer, packedbytes);
            nOut = packedbytes;
        }
    }
    else
    {
        nOut += nBytes;
        if (nOut < packedbytes)
        {
            unaligned_store32 (lengthptr, (uint32_t) nBytes);
        }
        else
        {
            memcpy (
                encode->compressed_buffer, encode->packed_buffer, packedbytes);
            nOut = packedbytes;
        }
    }
    encode->compressed_bytes = nOut;
    return EXR_ERR_SUCCESS;
}